

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

void __thiscall QStatusBar::setSizeGripEnabled(QStatusBar *this,bool enabled)

{
  QStatusBarPrivate *this_00;
  QSizeGrip *pQVar1;
  bool bVar2;
  QWidget *this_01;
  
  this_00 = *(QStatusBarPrivate **)&(this->super_QWidget).field_0x8;
  pQVar1 = this_00->resizer;
  if ((pQVar1 == (QSizeGrip *)0x0) == enabled) {
    if (enabled) {
      this_01 = (QWidget *)operator_new(0x28);
      QSizeGrip::QSizeGrip((QSizeGrip *)this_01,&this->super_QWidget);
      this_00->resizer = (QSizeGrip *)this_01;
      QWidget::hide(this_01);
      QObject::installEventFilter((QObject *)this_00->resizer);
      bVar2 = true;
    }
    else {
      if (pQVar1 != (QSizeGrip *)0x0) {
        (**(code **)(*(long *)&pQVar1->super_QWidget + 0x20))();
      }
      this_00->resizer = (QSizeGrip *)0x0;
      bVar2 = false;
    }
    this_00->showSizeGrip = bVar2;
    reformat(this);
    if ((this_00->resizer != (QSizeGrip *)0x0) &&
       ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0)) {
      QStatusBarPrivate::tryToShowSizeGrip(this_00);
      return;
    }
  }
  return;
}

Assistant:

void QStatusBar::setSizeGripEnabled(bool enabled)
{
#if !QT_CONFIG(sizegrip)
    Q_UNUSED(enabled);
#else
    Q_D(QStatusBar);
    if (!enabled != !d->resizer) {
        if (enabled) {
            d->resizer = new QSizeGrip(this);
            d->resizer->hide();
            d->resizer->installEventFilter(this);
            d->showSizeGrip = true;
        } else {
            delete d->resizer;
            d->resizer = nullptr;
            d->showSizeGrip = false;
        }
        reformat();
        if (d->resizer && isVisible())
            d->tryToShowSizeGrip();
    }
#endif
}